

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split-options.cpp
# Opt level: O0

void __thiscall wasm::WasmSplitOptions::WasmSplitOptions(WasmSplitOptions *this)

{
  initializer_list<wasm::WasmSplitOptions::Mode> __l;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_00;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_01;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_02;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_03;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_04;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_05;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_06;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_07;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_08;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_09;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_10;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_11;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_12;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_13;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_14;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_15;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_16;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_17;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_18;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_19;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_20;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_21;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_22;
  WasmSplitOptions *pWVar1;
  anon_class_8_1_8991fb9c local_1858;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1850;
  allocator<char> local_1829;
  string local_1828 [32];
  anon_class_8_1_8991fb9c local_1808;
  Action local_1800;
  allocator<char> local_17d9;
  string local_17d8;
  allocator<char> local_17b1;
  string local_17b0;
  allocator<char> local_1789;
  string local_1788;
  anon_class_8_1_8991fb9c local_1768;
  Action local_1760;
  allocator<char> local_1739;
  string local_1738;
  allocator<char> local_1711;
  string local_1710;
  allocator<char> local_16e9;
  string local_16e8;
  anon_class_8_1_8991fb9c local_16c8;
  Action local_16c0;
  allocator<wasm::WasmSplitOptions::Mode> local_169d;
  Mode local_169c [3];
  iterator local_1690;
  size_type local_1688;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_1680;
  allocator<char> local_1661;
  string local_1660;
  allocator<char> local_1639;
  string local_1638;
  allocator<char> local_1611;
  string local_1610;
  anon_class_8_1_8991fb9c local_15f0;
  Action local_15e8;
  allocator<wasm::WasmSplitOptions::Mode> local_15c5;
  Mode local_15c4 [3];
  iterator local_15b8;
  size_type local_15b0;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_15a8;
  allocator<char> local_1589;
  string local_1588;
  allocator<char> local_1561;
  string local_1560;
  allocator<char> local_1539;
  string local_1538;
  anon_class_8_1_8991fb9c local_1518;
  Action local_1510;
  allocator<wasm::WasmSplitOptions::Mode> local_14e9;
  Mode local_14e8 [2];
  iterator local_14e0;
  size_type local_14d8;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_14d0;
  allocator<char> local_14b1;
  string local_14b0;
  allocator<char> local_1489;
  string local_1488;
  allocator<char> local_1461;
  string local_1460;
  anon_class_8_1_8991fb9c local_1440;
  Action local_1438;
  allocator<wasm::WasmSplitOptions::Mode> local_1411;
  Mode local_1410 [2];
  iterator local_1408;
  size_type local_1400;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_13f8;
  allocator<char> local_13d9;
  string local_13d8;
  allocator<char> local_13b1;
  string local_13b0;
  allocator<char> local_1389;
  string local_1388;
  anon_class_8_1_8991fb9c local_1368;
  Action local_1360;
  allocator<wasm::WasmSplitOptions::Mode> local_1339;
  Mode local_1338 [2];
  iterator local_1330;
  size_type local_1328;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_1320;
  allocator<char> local_1301;
  string local_1300;
  allocator<char> local_12d9;
  string local_12d8;
  allocator<char> local_12b1;
  string local_12b0;
  anon_class_8_1_8991fb9c local_1290;
  Action local_1288;
  allocator<wasm::WasmSplitOptions::Mode> local_1265;
  Mode local_1264;
  iterator local_1260;
  size_type local_1258;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_1250;
  allocator<char> local_1231;
  string local_1230;
  allocator<char> local_1209;
  string local_1208;
  allocator<char> local_11e1;
  string local_11e0;
  anon_class_8_1_8991fb9c local_11c0;
  Action local_11b8;
  allocator<wasm::WasmSplitOptions::Mode> local_1195;
  Mode local_1194;
  iterator local_1190;
  size_type local_1188;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_1180;
  allocator<char> local_1161;
  string local_1160;
  allocator<char> local_1139;
  string local_1138;
  allocator<char> local_1111;
  string local_1110;
  anon_class_8_1_8991fb9c local_10f0;
  Action local_10e8;
  allocator<wasm::WasmSplitOptions::Mode> local_10c5;
  Mode local_10c4;
  iterator local_10c0;
  size_type local_10b8;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_10b0;
  allocator<char> local_1091;
  string local_1090;
  allocator<char> local_1069;
  string local_1068;
  allocator<char> local_1041;
  string local_1040;
  anon_class_8_1_8991fb9c local_1020;
  Action local_1018;
  allocator<wasm::WasmSplitOptions::Mode> local_ff5;
  Mode local_ff4;
  iterator local_ff0;
  size_type local_fe8;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_fe0;
  allocator<char> local_fc1;
  string local_fc0;
  allocator<char> local_f99;
  string local_f98;
  allocator<char> local_f71;
  string local_f70;
  anon_class_8_1_8991fb9c local_f50;
  Action local_f48;
  allocator<wasm::WasmSplitOptions::Mode> local_f25;
  Mode local_f24;
  iterator local_f20;
  size_type local_f18;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_f10;
  allocator<char> local_ef1;
  string local_ef0;
  allocator<char> local_ec9;
  string local_ec8;
  allocator<char> local_ea1;
  string local_ea0;
  anon_class_8_1_8991fb9c local_e80;
  Action local_e78;
  allocator<wasm::WasmSplitOptions::Mode> local_e55;
  Mode local_e54;
  iterator local_e50;
  size_type local_e48;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_e40;
  allocator<char> local_e21;
  string local_e20;
  allocator<char> local_df9;
  string local_df8;
  allocator<char> local_dd1;
  string local_dd0;
  anon_class_8_1_8991fb9c local_db0;
  Action local_da8;
  allocator<wasm::WasmSplitOptions::Mode> local_d85;
  Mode local_d84;
  iterator local_d80;
  size_type local_d78;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_d70;
  allocator<char> local_d51;
  string local_d50;
  allocator<char> local_d29;
  string local_d28;
  allocator<char> local_d01;
  string local_d00;
  anon_class_8_1_8991fb9c local_ce0;
  Action local_cd8;
  allocator<wasm::WasmSplitOptions::Mode> local_cb1;
  Mode local_cb0 [2];
  iterator local_ca8;
  size_type local_ca0;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_c98;
  allocator<char> local_c79;
  string local_c78;
  allocator<char> local_c51;
  string local_c50;
  allocator<char> local_c29;
  string local_c28;
  anon_class_8_1_8991fb9c local_c08;
  Action local_c00;
  allocator<wasm::WasmSplitOptions::Mode> local_bdd;
  Mode local_bdc;
  iterator local_bd8;
  size_type local_bd0;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_bc8;
  allocator<char> local_ba9;
  string local_ba8;
  allocator<char> local_b81;
  string local_b80;
  allocator<char> local_b59;
  string local_b58;
  anon_class_8_1_8991fb9c local_b38;
  Action local_b30;
  allocator<wasm::WasmSplitOptions::Mode> local_b0d;
  Mode local_b0c;
  iterator local_b08;
  size_type local_b00;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_af8;
  allocator<char> local_ad9;
  string local_ad8;
  allocator<char> local_ab1;
  string local_ab0;
  allocator<char> local_a89;
  string local_a88;
  anon_class_8_1_8991fb9c local_a68;
  Action local_a60;
  allocator<wasm::WasmSplitOptions::Mode> local_a3d;
  Mode local_a3c;
  iterator local_a38;
  size_type local_a30;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_a28;
  allocator<char> local_a09;
  string local_a08;
  allocator<char> local_9e1;
  string local_9e0;
  allocator<char> local_9b9;
  string local_9b8;
  anon_class_8_1_8991fb9c local_998;
  Action local_990;
  allocator<wasm::WasmSplitOptions::Mode> local_96d;
  Mode local_96c;
  iterator local_968;
  size_type local_960;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_958;
  allocator<char> local_939;
  string local_938;
  allocator<char> local_911;
  string local_910;
  allocator<char> local_8e9;
  string local_8e8;
  anon_class_8_1_8991fb9c local_8c8;
  Action local_8c0;
  allocator<wasm::WasmSplitOptions::Mode> local_89d;
  Mode local_89c;
  iterator local_898;
  size_type local_890;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_888;
  allocator<char> local_869;
  string local_868;
  allocator<char> local_841;
  string local_840;
  allocator<char> local_819;
  string local_818;
  anon_class_8_1_8991fb9c local_7f8;
  Action local_7f0;
  allocator<wasm::WasmSplitOptions::Mode> local_7cd;
  Mode local_7cc;
  iterator local_7c8;
  size_type local_7c0;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_7b8;
  allocator<char> local_799;
  string local_798;
  allocator<char> local_771;
  string local_770;
  allocator<char> local_749;
  string local_748;
  anon_class_8_1_8991fb9c local_728;
  Action local_720;
  allocator<wasm::WasmSplitOptions::Mode> local_6fd;
  Mode local_6fc;
  iterator local_6f8;
  size_type local_6f0;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_6e8;
  allocator<char> local_6c9;
  string local_6c8;
  allocator<char> local_6a1;
  string local_6a0;
  allocator<char> local_679;
  string local_678;
  anon_class_8_1_8991fb9c local_658;
  Action local_650;
  allocator<wasm::WasmSplitOptions::Mode> local_62d;
  Mode local_62c;
  iterator local_628;
  size_type local_620;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_618;
  allocator<char> local_5f9;
  string local_5f8;
  allocator<char> local_5d1;
  string local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  anon_class_8_1_8991fb9c local_588;
  Action local_580;
  allocator<wasm::WasmSplitOptions::Mode> local_55d;
  Mode local_55c;
  iterator local_558;
  size_type local_550;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_548;
  allocator<char> local_529;
  string local_528;
  allocator<char> local_501;
  string local_500;
  allocator<char> local_4d9;
  string local_4d8;
  anon_class_8_1_8991fb9c local_4b8;
  Action local_4b0;
  allocator<wasm::WasmSplitOptions::Mode> local_48d;
  Mode local_48c;
  iterator local_488;
  size_type local_480;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_478;
  allocator<char> local_459;
  string local_458;
  allocator<char> local_431;
  string local_430;
  allocator<char> local_409;
  string local_408;
  anon_class_8_1_8991fb9c local_3e8;
  Action local_3e0;
  allocator<wasm::WasmSplitOptions::Mode> local_3bd;
  Mode local_3bc;
  iterator local_3b8;
  size_type local_3b0;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_3a8;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  anon_class_8_1_8991fb9c local_318;
  Action local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  anon_class_8_1_8991fb9c local_278;
  Action local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  anon_class_8_1_8991fb9c local_1d8;
  Action local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  anon_class_8_1_8991fb9c local_138;
  Action local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  undefined1 local_90 [8];
  string WasmSplitOption;
  string local_68;
  allocator<char> local_31;
  string local_30;
  WasmSplitOptions *local_10;
  WasmSplitOptions *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"wasm-split",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,
             "Split a module into a primary module and a secondary module, or instrument a module to gather a profile that can inform future splitting, or manage such profiles. Options that are only accepted in particular modes are marked with the accepted \"[<modes>]\" in their descriptions."
             ,(allocator<char> *)(WasmSplitOption.field_2._M_local_buf + 0xf));
  ToolOptions::ToolOptions(&this->super_ToolOptions,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)(WasmSplitOption.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_ToolOptions)._vptr_ToolOptions = (_func_int **)&PTR_addPassArg_001bdc68;
  this->mode = Split;
  this->storageKind = InGlobals;
  this->usePlaceholders = true;
  this->unescape = false;
  this->verbose = false;
  this->emitBinary = true;
  this->symbolMap = false;
  this->placeholderMap = false;
  this->jspi = false;
  this->emitModuleNames = false;
  std::__cxx11::string::string((string *)&this->profileFile);
  std::__cxx11::string::string
            ((string *)&this->profileExport,(string *)DEFAULT_PROFILE_EXPORT_abi_cxx11_);
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::set(&this->keepFuncs);
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::set(&this->splitFuncs);
  this->hasKeepFuncs = false;
  this->hasSplitFuncs = false;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->inputFiles);
  std::__cxx11::string::string((string *)&this->output);
  std::__cxx11::string::string((string *)&this->primaryOutput);
  std::__cxx11::string::string((string *)&this->secondaryOutput);
  std::__cxx11::string::string((string *)&this->importNamespace);
  std::__cxx11::string::string((string *)&this->placeholderNamespace);
  std::__cxx11::string::string((string *)&this->secondaryMemoryName);
  std::__cxx11::string::string((string *)&this->exportPrefix);
  std::__cxx11::string::string((string *)&this->manifestFile);
  std::__cxx11::string::string((string *)&this->outPrefix);
  this->initialTableSize = -1;
  std::
  array<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_5UL>
  ::array(&this->validOptions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->usedOptions);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"wasm-split options",&local_91);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"--split",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"Split an input module into two output modules. The default mode."
             ,&local_109);
  local_138.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__0,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_130,&local_138);
  pWVar1 = add(this,&local_b8,&local_e0,&local_108,(string *)local_90,Zero,&local_130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"--multi-split",&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,
             "Split an input module into an arbitrary number of output modules.",&local_1a9);
  local_1d8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__1,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1d0,&local_1d8);
  pWVar1 = add(pWVar1,&local_158,&local_180,&local_1a8,(string *)local_90,Zero,&local_1d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"--instrument",&local_1f9)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"",&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,
             "Instrument an input module to allow it to generate a profile that can be used to guide splitting."
             ,&local_249);
  local_278.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__2,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_270,&local_278);
  pWVar1 = add(pWVar1,&local_1f8,&local_220,&local_248,(string *)local_90,Zero,&local_270);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"--merge-profiles",&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,
             "Merge multiple profiles for the same module into a single profile.",&local_2e9);
  local_318.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__3,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_310,&local_318);
  pWVar1 = add(pWVar1,&local_298,&local_2c0,&local_2e8,(string *)local_90,Zero,&local_310);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"--print-profile",&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"",&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"Print profile contents in a human-readable format.",&local_389);
  local_3bc = PrintProfile;
  local_3b8 = &local_3bc;
  local_3b0 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_3bd);
  __l_22._M_len = local_3b0;
  __l_22._M_array = local_3b8;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_3a8,__l_22,&local_3bd);
  local_3e8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__4,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_3e0,&local_3e8);
  pWVar1 = add(pWVar1,&local_338,&local_360,&local_388,(string *)local_90,&local_3a8,One,&local_3e0)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"--profile",&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"",&local_431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,"The profile to use to guide splitting.",&local_459);
  local_48c = Split;
  local_488 = &local_48c;
  local_480 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_48d);
  __l_21._M_len = local_480;
  __l_21._M_array = local_488;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_478,__l_21,&local_48d);
  local_4b8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__5,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_4b0,&local_4b8);
  pWVar1 = add(pWVar1,&local_408,&local_430,&local_458,(string *)local_90,&local_478,One,&local_4b0)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,"--keep-funcs",&local_4d9)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"",&local_501);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,
             "Comma-separated list of functions to keep in the primary module. The rest will be split out. Can be used alongside --profile and --split-funcs. You can also pass a file with one function per line by passing @filename."
             ,&local_529);
  local_55c = Split;
  local_558 = &local_55c;
  local_550 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_55d);
  __l_20._M_len = local_550;
  __l_20._M_array = local_558;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_548,__l_20,&local_55d);
  local_588.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__6,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_580,&local_588);
  pWVar1 = add(pWVar1,&local_4d8,&local_500,&local_528,(string *)local_90,&local_548,One,&local_580)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a8,"--split-funcs",&local_5a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d0,"",&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f8,
             "Comma-separated list of functions to split out to the secondary module. The rest will be kept. Can be used alongside --profile and --keep-funcs. This takes precedence over other split options. You can also pass a file with one function per line by passing @filename."
             ,&local_5f9);
  local_62c = Split;
  local_628 = &local_62c;
  local_620 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_62d);
  __l_19._M_len = local_620;
  __l_19._M_array = local_628;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_618,__l_19,&local_62d);
  local_658.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__7,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_650,&local_658);
  pWVar1 = add(pWVar1,&local_5a8,&local_5d0,&local_5f8,(string *)local_90,&local_618,One,&local_650)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_678,"--manifest",&local_679);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a0,"",&local_6a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c8,
             "File describing the functions to be split into each module. Each section separated by a blank line begins with the base name of an output module, which is followed by a list of functions to place in that module, one per line."
             ,&local_6c9);
  local_6fc = MultiSplit;
  local_6f8 = &local_6fc;
  local_6f0 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_6fd);
  __l_18._M_len = local_6f0;
  __l_18._M_array = local_6f8;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_6e8,__l_18,&local_6fd);
  local_728.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__8,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_720,&local_728);
  pWVar1 = add(pWVar1,&local_678,&local_6a0,&local_6c8,(string *)local_90,&local_6e8,One,&local_720)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_748,"--out-prefix",&local_749)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_770,"",&local_771);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_798,
             "Prefix prepended to module names in the manifest file to create output file names.",
             &local_799);
  local_7cc = MultiSplit;
  local_7c8 = &local_7cc;
  local_7c0 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_7cd);
  __l_17._M_len = local_7c0;
  __l_17._M_array = local_7c8;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_7b8,__l_17,&local_7cd);
  local_7f8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__9,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_7f0,&local_7f8);
  pWVar1 = add(pWVar1,&local_748,&local_770,&local_798,(string *)local_90,&local_7b8,One,&local_7f0)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_818,"--primary-output",&local_819);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_840,"-o1",&local_841);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_868,"Output file for the primary module.",&local_869);
  local_89c = Split;
  local_898 = &local_89c;
  local_890 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_89d);
  __l_16._M_len = local_890;
  __l_16._M_array = local_898;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_888,__l_16,&local_89d);
  local_8c8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__10,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_8c0,&local_8c8);
  pWVar1 = add(pWVar1,&local_818,&local_840,&local_868,(string *)local_90,&local_888,One,&local_8c0)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8e8,"--secondary-output",&local_8e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_910,"-o2",&local_911);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_938,"Output file for the secondary module.",&local_939);
  local_96c = Split;
  local_968 = &local_96c;
  local_960 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_96d);
  __l_15._M_len = local_960;
  __l_15._M_array = local_968;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_958,__l_15,&local_96d);
  local_998.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__11,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_990,&local_998);
  pWVar1 = add(pWVar1,&local_8e8,&local_910,&local_938,(string *)local_90,&local_958,One,&local_990)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9b8,"--symbolmap",&local_9b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e0,"",&local_9e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a08,"Write a symbol map file for each of the output modules.",
             &local_a09);
  local_a3c = Split;
  local_a38 = &local_a3c;
  local_a30 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_a3d);
  __l_14._M_len = local_a30;
  __l_14._M_array = local_a38;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_a28,__l_14,&local_a3d);
  local_a68.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__12,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_a60,&local_a68);
  pWVar1 = add(pWVar1,&local_9b8,&local_9e0,&local_a08,(string *)local_90,&local_a28,Zero,&local_a60
              );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a88,"--no-placeholders",&local_a89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ab0,"",&local_ab1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ad8,
             "Do not import placeholder functions. Calls to secondary functions will fail before the secondary module has been instantiated."
             ,&local_ad9);
  local_b0c = Split;
  local_b08 = &local_b0c;
  local_b00 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_b0d);
  __l_13._M_len = local_b00;
  __l_13._M_array = local_b08;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_af8,__l_13,&local_b0d);
  local_b38.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__13,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_b30,&local_b38);
  pWVar1 = add(pWVar1,&local_a88,&local_ab0,&local_ad8,(string *)local_90,&local_af8,Zero,&local_b30
              );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b58,"--placeholdermap",&local_b59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b80,"",&local_b81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ba8,"Write a file mapping placeholder indices to the function names.",
             &local_ba9);
  local_bdc = Split;
  local_bd8 = &local_bdc;
  local_bd0 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_bdd);
  __l_12._M_len = local_bd0;
  __l_12._M_array = local_bd8;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_bc8,__l_12,&local_bdd);
  local_c08.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__14,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_c00,&local_c08);
  pWVar1 = add(pWVar1,&local_b58,&local_b80,&local_ba8,(string *)local_90,&local_bc8,Zero,&local_c00
              );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c28,"--import-namespace",&local_c29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c50,"",&local_c51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c78,
             "When provided as an option for module splitting, the namespace from which to import objects from the primary module into the secondary module. In instrument mode, refers to the namespace from which to import the secondary memory, if any."
             ,&local_c79);
  local_cb0[0] = Split;
  local_cb0[1] = 2;
  local_ca8 = local_cb0;
  local_ca0 = 2;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_cb1);
  __l_11._M_len = local_ca0;
  __l_11._M_array = local_ca8;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_c98,__l_11,&local_cb1);
  local_ce0.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__15,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_cd8,&local_ce0);
  pWVar1 = add(pWVar1,&local_c28,&local_c50,&local_c78,(string *)local_90,&local_c98,One,&local_cd8)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d00,"--placeholder-namespace",&local_d01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d28,"",&local_d29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d50,
             "The namespace from which to import placeholder functions into the primary module.",
             &local_d51);
  local_d84 = Split;
  local_d80 = &local_d84;
  local_d78 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_d85);
  __l_10._M_len = local_d78;
  __l_10._M_array = local_d80;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_d70,__l_10,&local_d85);
  local_db0.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__16,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_da8,&local_db0);
  pWVar1 = add(pWVar1,&local_d00,&local_d28,&local_d50,(string *)local_90,&local_d70,One,&local_da8)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_dd0,"--jspi",&local_dd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_df8,"",&local_df9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e20,
             "Transform the module to support asynchronously loading the secondary module before any placeholder functions have been called."
             ,&local_e21);
  local_e54 = Split;
  local_e50 = &local_e54;
  local_e48 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_e55);
  __l_09._M_len = local_e48;
  __l_09._M_array = local_e50;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_e40,__l_09,&local_e55);
  local_e80.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__17,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_e78,&local_e80);
  pWVar1 = add(pWVar1,&local_dd0,&local_df8,&local_e20,(string *)local_90,&local_e40,Zero,&local_e78
              );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ea0,"--export-prefix",&local_ea1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ec8,"",&local_ec9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ef0,
             "An identifying prefix to prepend to new export names created by module splitting.",
             &local_ef1);
  local_f24 = Split;
  local_f20 = &local_f24;
  local_f18 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_f25);
  __l_08._M_len = local_f18;
  __l_08._M_array = local_f20;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_f10,__l_08,&local_f25);
  local_f50.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__18,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_f48,&local_f50);
  pWVar1 = add(pWVar1,&local_ea0,&local_ec8,&local_ef0,(string *)local_90,&local_f10,One,&local_f48)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f70,"--profile-export",&local_f71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f98,"",&local_f99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fc0,
             "The export name of the function the embedder calls to write the profile into memory. Defaults to `__write_profile`."
             ,&local_fc1);
  local_ff4 = Instrument;
  local_ff0 = &local_ff4;
  local_fe8 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_ff5);
  __l_07._M_len = local_fe8;
  __l_07._M_array = local_ff0;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_fe0,__l_07,&local_ff5);
  local_1020.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__19,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1018,&local_1020);
  pWVar1 = add(pWVar1,&local_f70,&local_f98,&local_fc0,(string *)local_90,&local_fe0,One,&local_1018
              );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1040,"--in-memory",&local_1041);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1068,"",&local_1069);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1090,
             "Store profile information in memory (starting at address 0 and taking one byte per function) rather than globals (the default) so that it can be shared between multiple threads. Users are responsible for ensuring that the module does not use the initial memory region for anything else."
             ,&local_1091);
  local_10c4 = Instrument;
  local_10c0 = &local_10c4;
  local_10b8 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_10c5);
  __l_06._M_len = local_10b8;
  __l_06._M_array = local_10c0;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_10b0,__l_06,&local_10c5);
  local_10f0.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__20,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_10e8,&local_10f0);
  pWVar1 = add(pWVar1,&local_1040,&local_1068,&local_1090,(string *)local_90,&local_10b0,Zero,
               &local_10e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1110,"--in-secondary-memory",&local_1111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1138,"",&local_1139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1160,
             "Store profile information in a separate memory, rather than in module main memory or globals (the default). With this option, users do not need to reserve the initial memory region for profile data and the data can be shared between multiple threads."
             ,&local_1161);
  local_1194 = Instrument;
  local_1190 = &local_1194;
  local_1188 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_1195);
  __l_05._M_len = local_1188;
  __l_05._M_array = local_1190;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_1180,__l_05,&local_1195);
  local_11c0.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__21,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_11b8,&local_11c0);
  pWVar1 = add(pWVar1,&local_1110,&local_1138,&local_1160,(string *)local_90,&local_1180,Zero,
               &local_11b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_11e0,"--secondary-memory-name",&local_11e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1208,"",&local_1209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1230,
             "The name of the secondary memory created to store profile information.",&local_1231);
  local_1264 = Instrument;
  local_1260 = &local_1264;
  local_1258 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_1265);
  __l_04._M_len = local_1258;
  __l_04._M_array = local_1260;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_1250,__l_04,&local_1265);
  local_1290.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__22,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1288,&local_1290);
  pWVar1 = add(pWVar1,&local_11e0,&local_1208,&local_1230,(string *)local_90,&local_1250,One,
               &local_1288);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12b0,"--emit-module-names",&local_12b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12d8,"",&local_12d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1300,
             "Emit module names, even if not emitting the rest of the names section. Can help differentiate the modules in stack traces. This option will be removed once simpler ways of naming modules are widely available. See https://bugs.chromium.org/p/v8/issues/detail?id=11808."
             ,&local_1301);
  local_1338[0] = Split;
  local_1338[1] = 2;
  local_1330 = local_1338;
  local_1328 = 2;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_1339);
  __l_03._M_len = local_1328;
  __l_03._M_array = local_1330;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_1320,__l_03,&local_1339);
  local_1368.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__23,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1360,&local_1368);
  pWVar1 = add(pWVar1,&local_12b0,&local_12d8,&local_1300,(string *)local_90,&local_1320,Zero,
               &local_1360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1388,"--initial-table",&local_1389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_13b0,"",&local_13b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_13d8,
             "A hack to ensure the split and instrumented modules have the same table size when using Emscripten\'s SPLIT_MODULE mode with dynamic linking. TODO: Figure out a more elegant solution for that use case and remove this."
             ,&local_13d9);
  local_1410[0] = Split;
  local_1410[1] = 2;
  local_1408 = local_1410;
  local_1400 = 2;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_1411);
  __l_02._M_len = local_1400;
  __l_02._M_array = local_1408;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_13f8,__l_02,&local_1411);
  local_1440.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__24,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1438,&local_1440);
  pWVar1 = add(pWVar1,&local_1388,&local_13b0,&local_13d8,(string *)local_90,&local_13f8,One,
               &local_1438);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1460,"--emit-text",&local_1461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1488,"-S",&local_1489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14b0,"Emit text instead of binary for the output file or files.",
             &local_14b1);
  local_14e8[0] = Split;
  local_14e8[1] = 2;
  local_14e0 = local_14e8;
  local_14d8 = 2;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_14e9);
  __l_01._M_len = local_14d8;
  __l_01._M_array = local_14e0;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_14d0,__l_01,&local_14e9);
  local_1518.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__25,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1510,&local_1518);
  pWVar1 = add(pWVar1,&local_1460,&local_1488,&local_14b0,(string *)local_90,&local_14d0,Zero,
               &local_1510);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1538,"--debuginfo",&local_1539);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1560,"-g",&local_1561);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1588,"Emit names section in wasm binary (or full debuginfo in wast)",
             &local_1589);
  local_15c4[0] = Split;
  local_15c4[1] = 1;
  local_15c4[2] = 2;
  local_15b8 = local_15c4;
  local_15b0 = 3;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_15c5);
  __l_00._M_len = local_15b0;
  __l_00._M_array = local_15b8;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_15a8,__l_00,&local_15c5);
  local_15f0.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__26,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_15e8,&local_15f0);
  pWVar1 = add(pWVar1,&local_1538,&local_1560,&local_1588,(string *)local_90,&local_15a8,Zero,
               &local_15e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1610,"--output",&local_1611);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1638,"-o",&local_1639);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1660,"Output file.",&local_1661);
  local_169c[0] = Instrument;
  local_169c[1] = 3;
  local_169c[2] = 1;
  local_1690 = local_169c;
  local_1688 = 3;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_169d);
  __l._M_len = local_1688;
  __l._M_array = local_1690;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_1680,__l,&local_169d);
  local_16c8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__27,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_16c0,&local_16c8);
  pWVar1 = add(pWVar1,&local_1610,&local_1638,&local_1660,(string *)local_90,&local_1680,One,
               &local_16c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_16e8,"--unescape",&local_16e9)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1710,"-u",&local_1711);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1738,"Un-escape function names (in print-profile output)",&local_1739)
  ;
  local_1768.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__28,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1760,&local_1768);
  pWVar1 = add(pWVar1,&local_16e8,&local_1710,&local_1738,(string *)local_90,Zero,&local_1760);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1788,"--verbose",&local_1789);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_17b0,"-v",&local_17b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_17d8,
             "Verbose output mode. Prints the functions that will be kept and split out when splitting a module."
             ,&local_17d9);
  local_1808.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__29,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1800,&local_1808);
  pWVar1 = add(pWVar1,&local_1788,&local_17b0,&local_17d8,(string *)local_90,Zero,&local_1800);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1828,"INFILES",&local_1829);
  local_1858.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__30,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1850,&local_1858);
  ::wasm::Options::add_positional
            ((string *)&(pWVar1->super_ToolOptions).super_Options,(Arguments)local_1828,
             (function *)0x2);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1850);
  std::__cxx11::string::~string(local_1828);
  std::allocator<char>::~allocator(&local_1829);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1800);
  std::__cxx11::string::~string((string *)&local_17d8);
  std::allocator<char>::~allocator(&local_17d9);
  std::__cxx11::string::~string((string *)&local_17b0);
  std::allocator<char>::~allocator(&local_17b1);
  std::__cxx11::string::~string((string *)&local_1788);
  std::allocator<char>::~allocator(&local_1789);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1760);
  std::__cxx11::string::~string((string *)&local_1738);
  std::allocator<char>::~allocator(&local_1739);
  std::__cxx11::string::~string((string *)&local_1710);
  std::allocator<char>::~allocator(&local_1711);
  std::__cxx11::string::~string((string *)&local_16e8);
  std::allocator<char>::~allocator(&local_16e9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_16c0);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_1680);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_169d);
  std::__cxx11::string::~string((string *)&local_1660);
  std::allocator<char>::~allocator(&local_1661);
  std::__cxx11::string::~string((string *)&local_1638);
  std::allocator<char>::~allocator(&local_1639);
  std::__cxx11::string::~string((string *)&local_1610);
  std::allocator<char>::~allocator(&local_1611);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_15e8);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_15a8);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_15c5);
  std::__cxx11::string::~string((string *)&local_1588);
  std::allocator<char>::~allocator(&local_1589);
  std::__cxx11::string::~string((string *)&local_1560);
  std::allocator<char>::~allocator(&local_1561);
  std::__cxx11::string::~string((string *)&local_1538);
  std::allocator<char>::~allocator(&local_1539);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1510);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_14d0);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_14e9);
  std::__cxx11::string::~string((string *)&local_14b0);
  std::allocator<char>::~allocator(&local_14b1);
  std::__cxx11::string::~string((string *)&local_1488);
  std::allocator<char>::~allocator(&local_1489);
  std::__cxx11::string::~string((string *)&local_1460);
  std::allocator<char>::~allocator(&local_1461);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1438);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_13f8);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_1411);
  std::__cxx11::string::~string((string *)&local_13d8);
  std::allocator<char>::~allocator(&local_13d9);
  std::__cxx11::string::~string((string *)&local_13b0);
  std::allocator<char>::~allocator(&local_13b1);
  std::__cxx11::string::~string((string *)&local_1388);
  std::allocator<char>::~allocator(&local_1389);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1360);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_1320);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_1339);
  std::__cxx11::string::~string((string *)&local_1300);
  std::allocator<char>::~allocator(&local_1301);
  std::__cxx11::string::~string((string *)&local_12d8);
  std::allocator<char>::~allocator(&local_12d9);
  std::__cxx11::string::~string((string *)&local_12b0);
  std::allocator<char>::~allocator(&local_12b1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1288);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_1250);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_1265);
  std::__cxx11::string::~string((string *)&local_1230);
  std::allocator<char>::~allocator(&local_1231);
  std::__cxx11::string::~string((string *)&local_1208);
  std::allocator<char>::~allocator(&local_1209);
  std::__cxx11::string::~string((string *)&local_11e0);
  std::allocator<char>::~allocator(&local_11e1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_11b8);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_1180);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_1195);
  std::__cxx11::string::~string((string *)&local_1160);
  std::allocator<char>::~allocator(&local_1161);
  std::__cxx11::string::~string((string *)&local_1138);
  std::allocator<char>::~allocator(&local_1139);
  std::__cxx11::string::~string((string *)&local_1110);
  std::allocator<char>::~allocator(&local_1111);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_10e8);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_10b0);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_10c5);
  std::__cxx11::string::~string((string *)&local_1090);
  std::allocator<char>::~allocator(&local_1091);
  std::__cxx11::string::~string((string *)&local_1068);
  std::allocator<char>::~allocator(&local_1069);
  std::__cxx11::string::~string((string *)&local_1040);
  std::allocator<char>::~allocator(&local_1041);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1018);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_fe0);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_ff5);
  std::__cxx11::string::~string((string *)&local_fc0);
  std::allocator<char>::~allocator(&local_fc1);
  std::__cxx11::string::~string((string *)&local_f98);
  std::allocator<char>::~allocator(&local_f99);
  std::__cxx11::string::~string((string *)&local_f70);
  std::allocator<char>::~allocator(&local_f71);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_f48);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_f10);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_f25);
  std::__cxx11::string::~string((string *)&local_ef0);
  std::allocator<char>::~allocator(&local_ef1);
  std::__cxx11::string::~string((string *)&local_ec8);
  std::allocator<char>::~allocator(&local_ec9);
  std::__cxx11::string::~string((string *)&local_ea0);
  std::allocator<char>::~allocator(&local_ea1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_e78);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_e40);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_e55);
  std::__cxx11::string::~string((string *)&local_e20);
  std::allocator<char>::~allocator(&local_e21);
  std::__cxx11::string::~string((string *)&local_df8);
  std::allocator<char>::~allocator(&local_df9);
  std::__cxx11::string::~string((string *)&local_dd0);
  std::allocator<char>::~allocator(&local_dd1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_da8);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_d70);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_d85);
  std::__cxx11::string::~string((string *)&local_d50);
  std::allocator<char>::~allocator(&local_d51);
  std::__cxx11::string::~string((string *)&local_d28);
  std::allocator<char>::~allocator(&local_d29);
  std::__cxx11::string::~string((string *)&local_d00);
  std::allocator<char>::~allocator(&local_d01);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_cd8);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_c98);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_cb1);
  std::__cxx11::string::~string((string *)&local_c78);
  std::allocator<char>::~allocator(&local_c79);
  std::__cxx11::string::~string((string *)&local_c50);
  std::allocator<char>::~allocator(&local_c51);
  std::__cxx11::string::~string((string *)&local_c28);
  std::allocator<char>::~allocator(&local_c29);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_c00);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_bc8);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_bdd);
  std::__cxx11::string::~string((string *)&local_ba8);
  std::allocator<char>::~allocator(&local_ba9);
  std::__cxx11::string::~string((string *)&local_b80);
  std::allocator<char>::~allocator(&local_b81);
  std::__cxx11::string::~string((string *)&local_b58);
  std::allocator<char>::~allocator(&local_b59);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_b30);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_af8);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_b0d);
  std::__cxx11::string::~string((string *)&local_ad8);
  std::allocator<char>::~allocator(&local_ad9);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::allocator<char>::~allocator(&local_ab1);
  std::__cxx11::string::~string((string *)&local_a88);
  std::allocator<char>::~allocator(&local_a89);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_a60);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_a28);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_a3d);
  std::__cxx11::string::~string((string *)&local_a08);
  std::allocator<char>::~allocator(&local_a09);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::allocator<char>::~allocator(&local_9e1);
  std::__cxx11::string::~string((string *)&local_9b8);
  std::allocator<char>::~allocator(&local_9b9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_990);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_958);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_96d);
  std::__cxx11::string::~string((string *)&local_938);
  std::allocator<char>::~allocator(&local_939);
  std::__cxx11::string::~string((string *)&local_910);
  std::allocator<char>::~allocator(&local_911);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::allocator<char>::~allocator(&local_8e9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_8c0);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_888);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_89d);
  std::__cxx11::string::~string((string *)&local_868);
  std::allocator<char>::~allocator(&local_869);
  std::__cxx11::string::~string((string *)&local_840);
  std::allocator<char>::~allocator(&local_841);
  std::__cxx11::string::~string((string *)&local_818);
  std::allocator<char>::~allocator(&local_819);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_7f0);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_7b8);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_7cd);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator(&local_799);
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator(&local_771);
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator(&local_749);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_720);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_6e8);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_6fd);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::allocator<char>::~allocator(&local_6c9);
  std::__cxx11::string::~string((string *)&local_6a0);
  std::allocator<char>::~allocator(&local_6a1);
  std::__cxx11::string::~string((string *)&local_678);
  std::allocator<char>::~allocator(&local_679);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_650);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_618);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_62d);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::allocator<char>::~allocator(&local_5f9);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_580);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_548);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_55d);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator(&local_501);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_4b0);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_478);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_48d);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator(&local_459);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator(&local_431);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_3e0);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_3a8);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_3bd);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_310);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_270);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1d0);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_130);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)local_90);
  return;
}

Assistant:

WasmSplitOptions::WasmSplitOptions()
  : ToolOptions("wasm-split",
                "Split a module into a primary module and a secondary "
                "module, or instrument a module to gather a profile that "
                "can inform future splitting, or manage such profiles. Options "
                "that are only accepted in particular modes are marked with "
                "the accepted \"[<modes>]\" in their descriptions.") {
  const std::string WasmSplitOption = "wasm-split options";

  (*this)
    .add("--split",
         "",
         "Split an input module into two output modules. The default mode.",
         WasmSplitOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { mode = Mode::Split; })
    .add(
      "--multi-split",
      "",
      "Split an input module into an arbitrary number of output modules.",
      WasmSplitOption,
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) { mode = Mode::MultiSplit; })
    .add(
      "--instrument",
      "",
      "Instrument an input module to allow it to generate a profile that can"
      " be used to guide splitting.",
      WasmSplitOption,
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) { mode = Mode::Instrument; })
    .add("--merge-profiles",
         "",
         "Merge multiple profiles for the same module into a single profile.",
         WasmSplitOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           mode = Mode::MergeProfiles;
         })
    .add("--print-profile",
         "",
         "Print profile contents in a human-readable format.",
         WasmSplitOption,
         {Mode::PrintProfile},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           mode = Mode::PrintProfile;
           profileFile = argument;
         })
    .add(
      "--profile",
      "",
      "The profile to use to guide splitting.",
      WasmSplitOption,
      {Mode::Split},
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) { profileFile = argument; })
    .add("--keep-funcs",
         "",
         "Comma-separated list of functions to keep in the primary module. The "
         "rest will be split out. Can be used alongside --profile and "
         "--split-funcs. You can also pass a file with one function per line "
         "by passing @filename.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           keepFuncs = parseNameList(argument);
           hasKeepFuncs = true;
         })
    .add("--split-funcs",
         "",
         "Comma-separated list of functions to split out to the secondary "
         "module. The rest will be kept. Can be used alongside --profile and "
         "--keep-funcs. This takes precedence over other split options. "
         "You can also pass a file with one function per line "
         "by passing @filename.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           splitFuncs = parseNameList(argument);
           hasSplitFuncs = true;
         })
    .add(
      "--manifest",
      "",
      "File describing the functions to be split into each module. Each "
      "section separated by a blank line begins with the base name of an "
      "output module, which is followed by a list of functions to place in "
      "that module, one per line.",
      WasmSplitOption,
      {Mode::MultiSplit},
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) { manifestFile = argument; })
    .add("--out-prefix",
         "",
         "Prefix prepended to module names in the manifest file to create "
         "output file names.",
         WasmSplitOption,
         {Mode::MultiSplit},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { outPrefix = argument; })
    .add("--primary-output",
         "-o1",
         "Output file for the primary module.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           primaryOutput = argument;
         })
    .add("--secondary-output",
         "-o2",
         "Output file for the secondary module.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           secondaryOutput = argument;
         })
    .add("--symbolmap",
         "",
         "Write a symbol map file for each of the output modules.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { symbolMap = true; })
    .add(
      "--no-placeholders",
      "",
      "Do not import placeholder functions. Calls to secondary functions will "
      "fail before the secondary module has been instantiated.",
      WasmSplitOption,
      {Mode::Split},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) { usePlaceholders = false; })
    .add(
      "--placeholdermap",
      "",
      "Write a file mapping placeholder indices to the function names.",
      WasmSplitOption,
      {Mode::Split},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) { placeholderMap = true; })
    .add("--import-namespace",
         "",
         "When provided as an option for module splitting, the namespace from "
         "which to import objects from the primary "
         "module into the secondary module. In instrument mode, refers to the "
         "namespace from which to import the secondary memory, if any.",
         WasmSplitOption,
         {Mode::Split, Mode::Instrument},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           importNamespace = argument;
         })
    .add("--placeholder-namespace",
         "",
         "The namespace from which to import placeholder functions into "
         "the primary module.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           placeholderNamespace = argument;
         })
    .add("--jspi",
         "",
         "Transform the module to support asynchronously loading the secondary "
         "module before any placeholder functions have been called.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { jspi = true; })
    .add(
      "--export-prefix",
      "",
      "An identifying prefix to prepend to new export names created "
      "by module splitting.",
      WasmSplitOption,
      {Mode::Split},
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) { exportPrefix = argument; })
    .add("--profile-export",
         "",
         "The export name of the function the embedder calls to write the "
         "profile into memory. Defaults to `__write_profile`.",
         WasmSplitOption,
         {Mode::Instrument},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           profileExport = argument;
         })
    .add(
      "--in-memory",
      "",
      "Store profile information in memory (starting at address 0 and taking "
      "one byte per function) rather than globals (the default) so that "
      "it can be shared between multiple threads. Users are responsible for "
      "ensuring that the module does not use the initial memory region for "
      "anything else.",
      WasmSplitOption,
      {Mode::Instrument},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) {
        storageKind = StorageKind::InMemory;
      })
    .add(
      "--in-secondary-memory",
      "",
      "Store profile information in a separate memory, rather than in module "
      "main memory or globals (the default). With this option, users do not "
      "need to reserve the initial memory region for profile data and the "
      "data can be shared between multiple threads.",
      WasmSplitOption,
      {Mode::Instrument},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) {
        storageKind = StorageKind::InSecondaryMemory;
      })
    .add("--secondary-memory-name",
         "",
         "The name of the secondary memory created to store profile "
         "information.",
         WasmSplitOption,
         {Mode::Instrument},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           secondaryMemoryName = argument;
         })
    .add(
      "--emit-module-names",
      "",
      "Emit module names, even if not emitting the rest of the names section. "
      "Can help differentiate the modules in stack traces. This option will be "
      "removed once simpler ways of naming modules are widely available. See "
      "https://bugs.chromium.org/p/v8/issues/detail?id=11808.",
      WasmSplitOption,
      {Mode::Split, Mode::Instrument},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& arguments) { emitModuleNames = true; })
    .add("--initial-table",
         "",
         "A hack to ensure the split and instrumented modules have the same "
         "table size when using Emscripten's SPLIT_MODULE mode with dynamic "
         "linking. TODO: Figure out a more elegant solution for that use "
         "case and remove this.",
         WasmSplitOption,
         {Mode::Split, Mode::Instrument},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           initialTableSize = std::stoi(argument);
         })
    .add("--emit-text",
         "-S",
         "Emit text instead of binary for the output file or files.",
         WasmSplitOption,
         {Mode::Split, Mode::Instrument},
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { emitBinary = false; })
    .add("--debuginfo",
         "-g",
         "Emit names section in wasm binary (or full debuginfo in wast)",
         WasmSplitOption,
         {Mode::Split, Mode::MultiSplit, Mode::Instrument},
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arguments) {
           passOptions.debugInfo = true;
         })
    .add("--output",
         "-o",
         "Output file.",
         WasmSplitOption,
         {Mode::Instrument, Mode::MergeProfiles, Mode::MultiSplit},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { output = argument; })
    .add("--unescape",
         "-u",
         "Un-escape function names (in print-profile output)",
         WasmSplitOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { unescape = true; })
    .add("--verbose",
         "-v",
         "Verbose output mode. Prints the functions that will be kept "
         "and split out when splitting a module.",
         WasmSplitOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           verbose = true;
           quiet = false;
         })
    .add_positional("INFILES",
                    Options::Arguments::N,
                    [&](Options* o, const std::string& argument) {
                      inputFiles.push_back(argument);
                    });
}